

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void close_state(lua_State *L)

{
  global_State *pgVar1;
  global_State *pgVar2;
  size_t sVar3;
  char *pcVar4;
  global_State *g;
  long lVar5;
  long lVar6;
  
  pgVar1 = L->l_G;
  luaF_close(L,L->stack);
  pgVar2 = L->l_G;
  pgVar2->currentwhite = 'C';
  sweeplist(L,&pgVar2->rootgc,0xfffffffffffffffd);
  if (0 < (pgVar2->strt).size) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      sweeplist(L,(GCObject **)((long)(pgVar2->strt).hash + lVar5),0xfffffffffffffffd);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 < (pgVar2->strt).size);
  }
  pgVar2 = L->l_G;
  lVar5 = (long)(pgVar2->strt).size;
  (*pgVar2->frealloc)(pgVar2->ud,(pgVar2->strt).hash,lVar5 * 8,0);
  pgVar2->totalbytes = pgVar2->totalbytes + lVar5 * -8;
  sVar3 = (pgVar1->buff).buffsize;
  pgVar2 = L->l_G;
  pcVar4 = (char *)(*pgVar2->frealloc)(pgVar2->ud,(pgVar1->buff).buffer,sVar3,0);
  pgVar2->totalbytes = pgVar2->totalbytes - sVar3;
  (pgVar1->buff).buffer = pcVar4;
  (pgVar1->buff).buffsize = 0;
  freestack(L,L);
  (*pgVar1->frealloc)(pgVar1->ud,L,0x268,0);
  return;
}

Assistant:

static void close_state(lua_State*L){
global_State*g=G(L);
luaF_close(L,L->stack);
luaC_freeall(L);
luaM_freearray(L,G(L)->strt.hash,G(L)->strt.size,TString*);
luaZ_freebuffer(L,&g->buff);
freestack(L,L);
(*g->frealloc)(g->ud,fromstate(L),state_size(LG),0);
}